

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O2

void Fra_ImpRecordInManager(Fra_Man_t *p,Aig_Man_t *pNew)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int i;
  Vec_Int_t *p_00;
  
  p_00 = p->pCla->vImps;
  if ((p_00 != (Vec_Int_t *)0x0) && (iVar2 = p_00->nSize, iVar2 != 0)) {
    iVar1 = pNew->nObjs[3];
    for (i = 0; i < iVar2; i = i + 1) {
      uVar3 = Vec_IntEntry(p_00,i);
      pAVar4 = Aig_ManObj(p->pManAig,uVar3 & 0xffff);
      pAVar5 = Aig_ManObj(p->pManAig,(int)uVar3 >> 0x10);
      pAVar4 = Aig_Or(pNew,(Aig_Obj_t *)
                           ((ulong)(*(uint *)&pAVar4->field_0x18 >> 3 & 1) ^
                            (ulong)(pAVar4->field_5).pData ^ 1),
                      (Aig_Obj_t *)
                      ((ulong)(*(uint *)&pAVar5->field_0x18 >> 3 & 1) ^
                      (ulong)(pAVar5->field_5).pData));
      Aig_ObjCreateCo(pNew,pAVar4);
      p_00 = p->pCla->vImps;
      iVar2 = p_00->nSize;
    }
    pNew->nAsserts = pNew->nObjs[3] - iVar1;
  }
  return;
}

Assistant:

void Fra_ImpRecordInManager( Fra_Man_t * p, Aig_Man_t * pNew )
{
    Aig_Obj_t * pLeft, * pRight, * pMiter;
    int nPosOld, Imp, i;
    if ( p->pCla->vImps == NULL || Vec_IntSize(p->pCla->vImps) == 0 )
        return;
    // go through the implication
    nPosOld = Aig_ManCoNum(pNew);
    Vec_IntForEachEntry( p->pCla->vImps, Imp, i )
    {
        pLeft = Aig_ManObj( p->pManAig, Fra_ImpLeft(Imp) );
        pRight = Aig_ManObj( p->pManAig, Fra_ImpRight(Imp) );
        // record the implication: L' + R
        pMiter = Aig_Or( pNew, 
            Aig_NotCond((Aig_Obj_t *)pLeft->pData, !pLeft->fPhase), 
            Aig_NotCond((Aig_Obj_t *)pRight->pData, pRight->fPhase) ); 
        Aig_ObjCreateCo( pNew, pMiter );
    }
    pNew->nAsserts = Aig_ManCoNum(pNew) - nPosOld;
}